

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Triple.cpp
# Opt level: O1

void __thiscall llvm::Triple::setOSName(Triple *this,StringRef Str)

{
  Child LHS;
  Child LHS_00;
  Child LHS_01;
  Child LHS_02;
  Child CVar1;
  Child CVar2;
  Child CVar3;
  Child CVar4;
  Child CVar5;
  Child CVar6;
  NodeKind NVar7;
  Child LHS_03;
  NodeKind RHSKind;
  Child CVar8;
  Child CVar9;
  StringRef SVar10;
  Child local_188;
  undefined4 uStack_180;
  undefined4 uStack_17c;
  undefined8 local_178;
  Child local_168;
  undefined4 uStack_160;
  undefined4 uStack_15c;
  undefined8 local_158;
  Child local_148;
  undefined4 uStack_140;
  undefined4 uStack_13c;
  undefined8 local_138;
  Child local_128;
  undefined4 uStack_120;
  undefined4 uStack_11c;
  undefined8 local_118;
  Child local_108;
  undefined4 uStack_100;
  undefined4 uStack_fc;
  undefined8 local_f8;
  uint local_e8;
  undefined4 uStack_e4;
  undefined4 uStack_e0;
  undefined4 uStack_dc;
  NodeKind local_d8;
  char cStack_d7;
  undefined6 uStack_d6;
  uint local_d0;
  undefined4 uStack_cc;
  undefined4 uStack_c8;
  undefined4 uStack_c4;
  NodeKind local_c0;
  char cStack_bf;
  undefined6 uStack_be;
  Child local_b8;
  undefined4 uStack_b0;
  undefined4 uStack_ac;
  NodeKind local_a8;
  char cStack_a7;
  undefined6 uStack_a6;
  Child local_a0;
  undefined4 uStack_98;
  undefined4 uStack_94;
  NodeKind local_90;
  char cStack_8f;
  undefined6 uStack_8e;
  uint local_88;
  undefined4 uStack_84;
  undefined4 uStack_80;
  undefined4 uStack_7c;
  NodeKind local_78;
  char cStack_77;
  undefined6 uStack_76;
  uint local_70;
  undefined4 uStack_6c;
  undefined4 uStack_68;
  undefined4 uStack_64;
  NodeKind local_60;
  char cStack_5f;
  undefined6 uStack_5e;
  StringRef local_58;
  StringRef local_48;
  StringRef local_38;
  StringRef local_28;
  
  local_58.Length = Str.Length;
  local_58.Data = Str.Data;
  SVar10 = getEnvironmentName(this);
  if (SVar10.Length == 0) {
    _local_a0 = getArchName(this);
    Twine::Twine((Twine *)&local_128,(StringRef *)&local_a0,"-");
    _local_b8 = getVendorName(this);
    Twine::Twine((Twine *)&local_148,(StringRef *)&local_b8);
    if (((NodeKind)local_118 == NullKind) || ((NodeKind)local_138 == NullKind)) {
      local_178 = CONCAT62(local_178._2_6_,0x100);
    }
    else if ((NodeKind)local_118 == EmptyKind) {
      local_178 = local_138;
      local_188.decUI = local_148.decUI;
      local_188._4_4_ = local_148._4_4_;
      uStack_180 = uStack_140;
      uStack_17c = uStack_13c;
    }
    else if ((NodeKind)local_138 == EmptyKind) {
      local_178 = local_118;
      local_188.decUI = local_128.decUI;
      local_188._4_4_ = local_128._4_4_;
      uStack_180 = uStack_120;
      uStack_17c = uStack_11c;
    }
    else {
      CVar8._4_4_ = local_128._4_4_;
      CVar8.decUI = local_128.decUI;
      NVar7 = (NodeKind)local_118;
      if (local_118._1_1_ != '\x01') {
        CVar8.twine = (Twine *)&local_128;
        NVar7 = TwineKind;
      }
      RHSKind = (NodeKind)local_138;
      if (local_138._1_1_ != '\x01') {
        RHSKind = TwineKind;
      }
      CVar1._4_4_ = local_148._4_4_;
      CVar1.decUI = local_148.decUI;
      CVar9.twine = (Twine *)&local_148;
      if (local_138._1_1_ == '\x01') {
        CVar9 = CVar1;
      }
      Twine::Twine((Twine *)&local_188,CVar8,NVar7,CVar9,RHSKind);
    }
    Twine::Twine((Twine *)&local_d0,"-");
    if (((NodeKind)local_178 == NullKind) || (local_c0 == NullKind)) {
      local_158 = CONCAT62(local_158._2_6_,0x100);
    }
    else if ((NodeKind)local_178 == EmptyKind) {
      local_158 = CONCAT62(uStack_be,CONCAT11(cStack_bf,local_c0));
      local_168.decUI = local_d0;
      local_168._4_4_ = uStack_cc;
      uStack_160 = uStack_c8;
      uStack_15c = uStack_c4;
    }
    else if (local_c0 == EmptyKind) {
      local_158 = local_178;
      local_168.decUI = local_188.decUI;
      local_168._4_4_ = local_188._4_4_;
      uStack_160 = uStack_180;
      uStack_15c = uStack_17c;
    }
    else {
      CVar9._4_4_ = local_188._4_4_;
      CVar9.decUI = local_188.decUI;
      NVar7 = (NodeKind)local_178;
      if (local_178._1_1_ != '\x01') {
        CVar9.twine = (Twine *)&local_188;
        NVar7 = TwineKind;
      }
      if (cStack_bf != '\x01') {
        local_c0 = TwineKind;
      }
      CVar4._4_4_ = uStack_cc;
      CVar4.decUI = local_d0;
      CVar8.twine = (Twine *)&local_d0;
      if (cStack_bf == '\x01') {
        CVar8 = CVar4;
      }
      Twine::Twine((Twine *)&local_168,CVar9,NVar7,CVar8,local_c0);
    }
    Twine::Twine((Twine *)&local_e8,&local_58);
    if (((NodeKind)local_158 == NullKind) || (local_d8 == NullKind)) goto LAB_001ae91a;
    if ((NodeKind)local_158 == EmptyKind) {
      local_f8 = CONCAT62(uStack_d6,CONCAT11(cStack_d7,local_d8));
      local_108.decUI = local_e8;
      local_108._4_4_ = uStack_e4;
      uStack_100 = uStack_e0;
      uStack_fc = uStack_dc;
      goto LAB_001ae991;
    }
    if (local_d8 != EmptyKind) {
      LHS_03._4_4_ = local_168._4_4_;
      LHS_03.decUI = local_168.decUI;
      NVar7 = (NodeKind)local_158;
      if (local_158._1_1_ != '\x01') {
        NVar7 = TwineKind;
        LHS_03.twine = (Twine *)&local_168;
      }
      local_78 = local_d8;
      if (cStack_d7 != '\x01') {
        local_78 = TwineKind;
      }
      CVar3._4_4_ = uStack_e4;
      CVar3.decUI = local_e8;
      CVar8.twine = (Twine *)&local_e8;
      if (cStack_d7 == '\x01') {
        CVar8 = CVar3;
      }
      goto LAB_001ae977;
    }
  }
  else {
    local_28 = getArchName(this);
    Twine::Twine((Twine *)&local_d0,&local_28,"-");
    local_38 = getVendorName(this);
    Twine::Twine((Twine *)&local_e8,&local_38);
    if ((local_c0 == NullKind) || (local_d8 == NullKind)) {
      local_138 = CONCAT62(local_138._2_6_,0x100);
    }
    else if (local_c0 == EmptyKind) {
      local_138 = CONCAT62(uStack_d6,CONCAT11(cStack_d7,local_d8));
      local_148.decUI = local_e8;
      local_148._4_4_ = uStack_e4;
      uStack_140 = uStack_e0;
      uStack_13c = uStack_dc;
    }
    else if (local_d8 == EmptyKind) {
      local_138 = CONCAT62(uStack_be,CONCAT11(cStack_bf,local_c0));
      local_148.decUI = local_d0;
      local_148._4_4_ = uStack_cc;
      uStack_140 = uStack_c8;
      uStack_13c = uStack_c4;
    }
    else {
      LHS._4_4_ = uStack_cc;
      LHS.decUI = local_d0;
      if (cStack_bf != '\x01') {
        local_c0 = TwineKind;
        LHS.twine = (Twine *)&local_d0;
      }
      if (cStack_d7 != '\x01') {
        local_d8 = TwineKind;
      }
      CVar2._4_4_ = uStack_e4;
      CVar2.decUI = local_e8;
      CVar8.twine = (Twine *)&local_e8;
      if (cStack_d7 == '\x01') {
        CVar8 = CVar2;
      }
      Twine::Twine((Twine *)&local_148,LHS,local_c0,CVar8,local_d8);
    }
    Twine::Twine((Twine *)&local_a0,"-");
    if (((NodeKind)local_138 == NullKind) || (local_90 == NullKind)) {
      local_118 = CONCAT62(local_118._2_6_,0x100);
    }
    else if ((NodeKind)local_138 == EmptyKind) {
      local_118 = CONCAT62(uStack_8e,CONCAT11(cStack_8f,local_90));
      local_128.decUI = local_a0.decUI;
      local_128._4_4_ = local_a0._4_4_;
      uStack_120 = uStack_98;
      uStack_11c = uStack_94;
    }
    else if (local_90 == EmptyKind) {
      local_118 = local_138;
      local_128.decUI = local_148.decUI;
      local_128._4_4_ = local_148._4_4_;
      uStack_120 = uStack_140;
      uStack_11c = uStack_13c;
    }
    else {
      LHS_00._4_4_ = local_148._4_4_;
      LHS_00.decUI = local_148.decUI;
      NVar7 = (NodeKind)local_138;
      if (local_138._1_1_ != '\x01') {
        LHS_00.twine = (Twine *)&local_148;
        NVar7 = TwineKind;
      }
      if (cStack_8f != '\x01') {
        local_90 = TwineKind;
      }
      CVar8.twine = (Twine *)&local_a0;
      if (cStack_8f == '\x01') {
        CVar8 = local_a0;
      }
      Twine::Twine((Twine *)&local_128,LHS_00,NVar7,CVar8,local_90);
    }
    Twine::Twine((Twine *)&local_b8,&local_58);
    if (((NodeKind)local_118 == NullKind) || (local_a8 == NullKind)) {
      local_178 = CONCAT62(local_178._2_6_,0x100);
    }
    else if ((NodeKind)local_118 == EmptyKind) {
      local_178 = CONCAT62(uStack_a6,CONCAT11(cStack_a7,local_a8));
      local_188.decUI = local_b8.decUI;
      local_188._4_4_ = local_b8._4_4_;
      uStack_180 = uStack_b0;
      uStack_17c = uStack_ac;
    }
    else if (local_a8 == EmptyKind) {
      local_178 = local_118;
      local_188.decUI = local_128.decUI;
      local_188._4_4_ = local_128._4_4_;
      uStack_180 = uStack_120;
      uStack_17c = uStack_11c;
    }
    else {
      LHS_01._4_4_ = local_128._4_4_;
      LHS_01.decUI = local_128.decUI;
      NVar7 = (NodeKind)local_118;
      if (local_118._1_1_ != '\x01') {
        LHS_01.twine = (Twine *)&local_128;
        NVar7 = TwineKind;
      }
      if (cStack_a7 != '\x01') {
        local_a8 = TwineKind;
      }
      CVar8.twine = (Twine *)&local_b8;
      if (cStack_a7 == '\x01') {
        CVar8 = local_b8;
      }
      Twine::Twine((Twine *)&local_188,LHS_01,NVar7,CVar8,local_a8);
    }
    Twine::Twine((Twine *)&local_70,"-");
    if (((NodeKind)local_178 == NullKind) || (local_60 == NullKind)) {
      local_158 = CONCAT62(local_158._2_6_,0x100);
    }
    else if ((NodeKind)local_178 == EmptyKind) {
      local_158 = CONCAT62(uStack_5e,CONCAT11(cStack_5f,local_60));
      local_168.decUI = local_70;
      local_168._4_4_ = uStack_6c;
      uStack_160 = uStack_68;
      uStack_15c = uStack_64;
    }
    else if (local_60 == EmptyKind) {
      local_158 = local_178;
      local_168.decUI = local_188.decUI;
      local_168._4_4_ = local_188._4_4_;
      uStack_160 = uStack_180;
      uStack_15c = uStack_17c;
    }
    else {
      LHS_02._4_4_ = local_188._4_4_;
      LHS_02.decUI = local_188.decUI;
      NVar7 = (NodeKind)local_178;
      if (local_178._1_1_ != '\x01') {
        LHS_02.twine = (Twine *)&local_188;
        NVar7 = TwineKind;
      }
      if (cStack_5f != '\x01') {
        local_60 = TwineKind;
      }
      CVar6._4_4_ = uStack_6c;
      CVar6.decUI = local_70;
      CVar8.twine = (Twine *)&local_70;
      if (cStack_5f == '\x01') {
        CVar8 = CVar6;
      }
      Twine::Twine((Twine *)&local_168,LHS_02,NVar7,CVar8,local_60);
    }
    local_48 = getEnvironmentName(this);
    Twine::Twine((Twine *)&local_88,&local_48);
    if (((NodeKind)local_158 == NullKind) || (local_78 == NullKind)) {
LAB_001ae91a:
      local_f8 = CONCAT62(local_f8._2_6_,0x100);
      goto LAB_001ae991;
    }
    if ((NodeKind)local_158 == EmptyKind) {
      local_f8 = CONCAT62(uStack_76,CONCAT11(cStack_77,local_78));
      local_108.decUI = local_88;
      local_108._4_4_ = uStack_84;
      uStack_100 = uStack_80;
      uStack_fc = uStack_7c;
      goto LAB_001ae991;
    }
    if (local_78 != EmptyKind) {
      LHS_03._4_4_ = local_168._4_4_;
      LHS_03.decUI = local_168.decUI;
      NVar7 = (NodeKind)local_158;
      if (local_158._1_1_ != '\x01') {
        LHS_03.twine = (Twine *)&local_168;
        NVar7 = TwineKind;
      }
      if (cStack_77 != '\x01') {
        local_78 = TwineKind;
      }
      CVar5._4_4_ = uStack_84;
      CVar5.decUI = local_88;
      CVar8.twine = (Twine *)&local_88;
      if (cStack_77 == '\x01') {
        CVar8 = CVar5;
      }
LAB_001ae977:
      Twine::Twine((Twine *)&local_108,LHS_03,NVar7,CVar8,local_78);
      goto LAB_001ae991;
    }
  }
  local_f8 = local_158;
  local_108.decUI = local_168.decUI;
  local_108._4_4_ = local_168._4_4_;
  uStack_100 = uStack_160;
  uStack_fc = uStack_15c;
LAB_001ae991:
  setTriple(this,(Twine *)&local_108);
  return;
}

Assistant:

void Triple::setOSName(StringRef Str) {
  if (hasEnvironment())
    setTriple(getArchName() + "-" + getVendorName() + "-" + Str +
              "-" + getEnvironmentName());
  else
    setTriple(getArchName() + "-" + getVendorName() + "-" + Str);
}